

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         GeneratedClassNameImpl<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc)

{
  string *psVar1;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Descriptor *local_58;
  Descriptor *containing;
  string local_40;
  undefined1 local_19;
  EnumDescriptor *local_18;
  EnumDescriptor *desc_local;
  string *classname;
  
  local_19 = 0;
  local_18 = desc;
  desc_local = (EnumDescriptor *)__return_storage_ptr__;
  psVar1 = EnumDescriptor::name_abi_cxx11_(desc);
  ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_40,psVar1,local_18);
  psVar1 = EnumDescriptor::name_abi_cxx11_(local_18);
  std::operator+(__return_storage_ptr__,&local_40,psVar1);
  std::__cxx11::string::~string((string *)&local_40);
  for (local_58 = EnumDescriptor::containing_type(local_18); local_58 != (Descriptor *)0x0;
      local_58 = Descriptor::containing_type(local_58)) {
    psVar1 = Descriptor::name_abi_cxx11_(local_58);
    ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_d8,psVar1,local_18);
    psVar1 = Descriptor::name_abi_cxx11_(local_58);
    std::operator+(&local_b8,&local_d8,psVar1);
    std::operator+(&local_98,&local_b8,'\\');
    std::operator+(&local_78,&local_98,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassNameImpl(const DescriptorType* desc) {
  std::string classname = ClassNamePrefix(desc->name(), desc) + desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = ClassNamePrefix(containing->name(), desc) + containing->name()
       + '\\' + classname;
    containing = containing->containing_type();
  }
  return classname;
}